

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

void tt_cmap13_next(TT_CMap13 cmap)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  FT_Byte *pFVar5;
  uint uVar6;
  
  if (cmap->cur_charcode < 0xffffffff) {
    uVar4 = cmap->cur_group;
    if (uVar4 < cmap->num_groups) {
      pFVar5 = (cmap->cmap).data + uVar4 * 0xc + 0x1b;
      uVar2 = cmap->cur_charcode + 1;
      do {
        uVar6 = *(uint *)(pFVar5 + -0xb);
        uVar1 = *(uint *)(pFVar5 + -7);
        uVar3 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                       uVar6 << 0x18);
        if (uVar3 < uVar2) {
          uVar3 = uVar2;
        }
        if (uVar3 <= (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18)) {
          uVar6 = *(uint *)(pFVar5 + -3);
          uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          if ((uVar6 != 0) && (uVar6 < (uint)((cmap->cmap).cmap.charmap.face)->num_glyphs)) {
            cmap->cur_charcode = uVar3;
            cmap->cur_gindex = uVar6;
            cmap->cur_group = uVar4;
            return;
          }
        }
        uVar4 = uVar4 + 1;
        pFVar5 = pFVar5 + 0xc;
        uVar2 = uVar3;
      } while (cmap->num_groups != uVar4);
    }
  }
  cmap->valid = '\0';
  return;
}

Assistant:

static void
  tt_cmap13_next( TT_CMap13  cmap )
  {
    FT_Face   face = cmap->cmap.cmap.charmap.face;
    FT_Byte*  p;
    FT_ULong  start, end, glyph_id, char_code;
    FT_ULong  n;
    FT_UInt   gindex;


    if ( cmap->cur_charcode >= 0xFFFFFFFFUL )
      goto Fail;

    char_code = cmap->cur_charcode + 1;

    for ( n = cmap->cur_group; n < cmap->num_groups; n++ )
    {
      p        = cmap->cmap.data + 16 + 12 * n;
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      glyph_id = TT_PEEK_ULONG( p );

      if ( char_code < start )
        char_code = start;

      if ( char_code <= end )
      {
        gindex = (FT_UInt)glyph_id;

        if ( gindex && gindex < (FT_UInt)face->num_glyphs )
        {
          cmap->cur_charcode = char_code;
          cmap->cur_gindex   = gindex;
          cmap->cur_group    = n;

          return;
        }
      }
    }

  Fail:
    cmap->valid = 0;
  }